

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O2

int png_image_read_and_map(png_voidp argument)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined8 *puVar4;
  png_const_structrp png_ptr;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  char cVar16;
  uint uVar18;
  char cVar19;
  ulong uVar21;
  ushort *row;
  uint local_78;
  uint local_74;
  ulong local_50;
  char cVar17;
  char cVar20;
  
  puVar4 = *argument;
  png_ptr = *(png_const_structrp *)*puVar4;
  local_78 = 1;
  if (png_ptr->interlaced != '\0') {
    if (png_ptr->interlaced != '\x01') {
      png_error(png_ptr,"unknown interlace type");
    }
    local_78 = 7;
  }
  uVar1 = *(uint *)((long)puVar4 + 0xc);
  uVar2 = *(uint *)(puVar4 + 2);
  iVar3 = *(int *)((long)argument + 0x48);
  lVar5 = *(long *)((long)argument + 0x30);
  lVar6 = *(long *)((long)argument + 0x38);
  uVar7 = 0;
LAB_00111156:
  uVar18 = uVar7;
  if (uVar18 == local_78) {
    return 1;
  }
  if (png_ptr->interlaced == '\x01') goto code_r0x00111174;
  uVar13 = 0;
  local_74 = 1;
  uVar21 = 1;
  local_50 = 0;
  goto LAB_0011140e;
code_r0x00111174:
  bVar12 = (byte)(7 - uVar18 >> 1);
  bVar11 = 3;
  if (1 < uVar18) {
    bVar11 = bVar12;
  }
  uVar15 = (uVar18 & 1) << (3U - (char)(uVar18 + 1 >> 1) & 0x1f) & 7;
  uVar7 = uVar18 + 1;
  if ((~(-1 << (bVar11 & 0x1f)) + uVar1) - uVar15 >> (bVar11 & 0x1f) != 0) {
    uVar21 = (ulong)(uint)(1 << (bVar12 & 0x1f));
    uVar13 = (ulong)((uVar18 & 1 ^ 1) << (3U - (char)(uVar18 >> 1) & 0x1f) & 7);
    local_74 = 8 >> ((byte)(uVar18 - 1 >> 1) & 0x1f);
    if (uVar18 < 3) {
      local_74 = 8;
    }
    local_50 = (ulong)uVar15;
LAB_0011140e:
    for (; (uint)uVar13 < uVar2; uVar13 = (ulong)((uint)uVar13 + local_74)) {
      row = *(ushort **)((long)argument + 0x28);
      png_read_row(png_ptr,(png_bytep)row,(png_bytep)0x0);
      if (iVar3 - 1U < 4) {
        lVar8 = uVar13 * lVar6 + lVar5;
        pbVar10 = (byte *)((ulong)uVar1 + lVar8);
        pbVar9 = (byte *)(lVar8 + local_50);
        switch(iVar3) {
        case 1:
          for (; pbVar9 < pbVar10; pbVar9 = pbVar9 + uVar21) {
            bVar11 = (byte)*row;
            bVar12 = *(byte *)((long)row + 1);
            if (bVar12 < 0xe6) {
              bVar14 = 0xe7;
              if (0x19 < bVar12) {
                bVar14 = ((char)((uint)bVar12 + (uint)bVar12 * 4 + 0x82 >> 8) * '\x06' +
                         (char)((uint)bVar11 + (uint)bVar11 * 4 + 0x82 >> 8)) - 0x1e;
              }
            }
            else {
              bVar14 = (byte)((uint)bVar11 * 0xe7 + 0x80 >> 8);
            }
            *pbVar9 = bVar14;
            row = row + 1;
          }
          break;
        case 2:
          for (; pbVar9 < pbVar10; pbVar9 = pbVar9 + uVar21) {
            bVar11 = (byte)*row;
            if (bVar11 == 0xfe) {
              bVar11 = 0xff;
            }
            if (*(byte *)((long)row + 1) == 0) {
              bVar11 = 0xfe;
            }
            *pbVar9 = bVar11;
            row = row + 1;
          }
          break;
        case 3:
          for (; pbVar9 < pbVar10; pbVar9 = pbVar9 + uVar21) {
            *pbVar9 = (char)((uint)(byte)row[1] + (uint)(byte)row[1] * 4 + 0x82 >> 8) +
                      ((char)((ushort)((*row >> 8) * 5 + 0x82) >> 8) +
                      (char)((ushort)((*row & 0xff) * 5 + 0x82) >> 8) * '\x06') * '\x06';
            row = (ushort *)((long)row + 3);
          }
          break;
        case 4:
          for (; pbVar9 < pbVar10; pbVar9 = pbVar9 + uVar21) {
            if (*(byte *)((long)row + 3) < 0xc4) {
              bVar11 = 0xd8;
              if (0x3f < *(byte *)((long)row + 3)) {
                bVar11 = (byte)*row;
                cVar16 = ((char)bVar11 < '\0') * '\t';
                bVar12 = bVar11 & 0x40;
                cVar19 = cVar16 + -0x1e;
                cVar20 = cVar19;
                if (bVar12 == 0) {
                  cVar19 = ((char)bVar11 < '\0') * '\t' + -0x27;
                  cVar20 = cVar16 + -0x27;
                }
                cVar16 = cVar20 + '\x03';
                cVar17 = cVar20 + '\x03';
                if (-1 < (char)bVar11) {
                  cVar16 = cVar19;
                  cVar17 = cVar20;
                }
                cVar19 = cVar17 + '\x03';
                if (bVar12 == 0) {
                  cVar19 = cVar16;
                }
                bVar11 = ((bVar12 >> 6) - ((char)bVar11 >> 7)) + cVar19;
              }
            }
            else {
              bVar11 = (char)((uint)(byte)row[1] + (uint)(byte)row[1] * 4 + 0x82 >> 8) +
                       ((char)((ushort)((*row >> 8) * 5 + 0x82) >> 8) +
                       (char)((ushort)((*row & 0xff) * 5 + 0x82) >> 8) * '\x06') * '\x06';
            }
            *pbVar9 = bVar11;
            row = row + 2;
          }
        }
      }
    }
    uVar7 = uVar18 + 1;
  }
  goto LAB_00111156;
}

Assistant:

static int
png_image_read_and_map(png_voidp argument)
{
   png_image_read_control *display = png_voidcast(png_image_read_control*,
       argument);
   png_imagep image = display->image;
   png_structrp png_ptr = image->opaque->png_ptr;
   int passes;

   /* Called when the libpng data must be transformed into the color-mapped
    * form.  There is a local row buffer in display->local and this routine must
    * do the interlace handling.
    */
   switch (png_ptr->interlaced)
   {
      case PNG_INTERLACE_NONE:
         passes = 1;
         break;

      case PNG_INTERLACE_ADAM7:
         passes = PNG_INTERLACE_ADAM7_PASSES;
         break;

      default:
         png_error(png_ptr, "unknown interlace type");
   }

   {
      png_uint_32  height = image->height;
      png_uint_32  width = image->width;
      int          proc = display->colormap_processing;
      png_bytep    first_row = png_voidcast(png_bytep, display->first_row);
      ptrdiff_t    step_row = display->row_bytes;
      int pass;

      for (pass = 0; pass < passes; ++pass)
      {
         unsigned int     startx, stepx, stepy;
         png_uint_32      y;

         if (png_ptr->interlaced == PNG_INTERLACE_ADAM7)
         {
            /* The row may be empty for a short image: */
            if (PNG_PASS_COLS(width, pass) == 0)
               continue;

            startx = PNG_PASS_START_COL(pass);
            stepx = PNG_PASS_COL_OFFSET(pass);
            y = PNG_PASS_START_ROW(pass);
            stepy = PNG_PASS_ROW_OFFSET(pass);
         }

         else
         {
            y = 0;
            startx = 0;
            stepx = stepy = 1;
         }

         for (; y<height; y += stepy)
         {
            png_bytep inrow = png_voidcast(png_bytep, display->local_row);
            png_bytep outrow = first_row + y * step_row;
            png_const_bytep end_row = outrow + width;

            /* Read read the libpng data into the temporary buffer. */
            png_read_row(png_ptr, inrow, NULL);

            /* Now process the row according to the processing option, note
             * that the caller verifies that the format of the libpng output
             * data is as required.
             */
            outrow += startx;
            switch (proc)
            {
               case PNG_CMAP_GA:
                  for (; outrow < end_row; outrow += stepx)
                  {
                     /* The data is always in the PNG order */
                     unsigned int gray = *inrow++;
                     unsigned int alpha = *inrow++;
                     unsigned int entry;

                     /* NOTE: this code is copied as a comment in
                      * make_ga_colormap above.  Please update the
                      * comment if you change this code!
                      */
                     if (alpha > 229) /* opaque */
                     {
                        entry = (231 * gray + 128) >> 8;
                     }
                     else if (alpha < 26) /* transparent */
                     {
                        entry = 231;
                     }
                     else /* partially opaque */
                     {
                        entry = 226 + 6 * PNG_DIV51(alpha) + PNG_DIV51(gray);
                     }

                     *outrow = (png_byte)entry;
                  }
                  break;

               case PNG_CMAP_TRANS:
                  for (; outrow < end_row; outrow += stepx)
                  {
                     png_byte gray = *inrow++;
                     png_byte alpha = *inrow++;

                     if (alpha == 0)
                        *outrow = PNG_CMAP_TRANS_BACKGROUND;

                     else if (gray != PNG_CMAP_TRANS_BACKGROUND)
                        *outrow = gray;

                     else
                        *outrow = (png_byte)(PNG_CMAP_TRANS_BACKGROUND+1);
                  }
                  break;

               case PNG_CMAP_RGB:
                  for (; outrow < end_row; outrow += stepx)
                  {
                     *outrow = PNG_RGB_INDEX(inrow[0], inrow[1], inrow[2]);
                     inrow += 3;
                  }
                  break;

               case PNG_CMAP_RGB_ALPHA:
                  for (; outrow < end_row; outrow += stepx)
                  {
                     unsigned int alpha = inrow[3];

                     /* Because the alpha entries only hold alpha==0.5 values
                      * split the processing at alpha==0.25 (64) and 0.75
                      * (196).
                      */

                     if (alpha >= 196)
                        *outrow = PNG_RGB_INDEX(inrow[0], inrow[1],
                            inrow[2]);

                     else if (alpha < 64)
                        *outrow = PNG_CMAP_RGB_ALPHA_BACKGROUND;

                     else
                     {
                        /* Likewise there are three entries for each of r, g
                         * and b.  We could select the entry by popcount on
                         * the top two bits on those architectures that
                         * support it, this is what the code below does,
                         * crudely.
                         */
                        unsigned int back_i = PNG_CMAP_RGB_ALPHA_BACKGROUND+1;

                        /* Here are how the values map:
                         *
                         * 0x00 .. 0x3f -> 0
                         * 0x40 .. 0xbf -> 1
                         * 0xc0 .. 0xff -> 2
                         *
                         * So, as above with the explicit alpha checks, the
                         * breakpoints are at 64 and 196.
                         */
                        if (inrow[0] & 0x80) back_i += 9; /* red */
                        if (inrow[0] & 0x40) back_i += 9;
                        if (inrow[0] & 0x80) back_i += 3; /* green */
                        if (inrow[0] & 0x40) back_i += 3;
                        if (inrow[0] & 0x80) back_i += 1; /* blue */
                        if (inrow[0] & 0x40) back_i += 1;

                        *outrow = (png_byte)back_i;
                     }

                     inrow += 4;
                  }
                  break;

               default:
                  break;
            }
         }
      }
   }

   return 1;
}